

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

bool __thiscall Builder::FinishCommand(Builder *this,Result *result,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Edge *this_00;
  BuildLog *this_01;
  Metrics *this_02;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  pointer ppNVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  long *plVar10;
  Metric *pMVar11;
  long *plVar12;
  TimeStamp mtime;
  pointer ppNVar13;
  string rspfile;
  string deps_type;
  int end_time;
  int start_time;
  string deps_prefix;
  vector<Node_*,_std::allocator<Node_*>_> deps_nodes;
  ScopedMetric metrics_h_scoped;
  string local_110;
  string local_f0;
  int local_d0;
  int local_cc;
  string local_c8;
  long *local_a8 [2];
  long local_98 [2];
  vector<Node_*,_std::allocator<Node_*>_> local_88;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  DependencyScan *local_50;
  Plan *local_48;
  ScopedMetric local_40;
  
  if ((FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar5 = __cxa_guard_acquire(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                                   metrics_h_metric), this_02 = g_metrics, iVar5 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar11 = (Metric *)0x0;
    }
    else {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"FinishCommand","");
      pMVar11 = Metrics::NewMetric(this_02,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
    }
    FinishCommand::metrics_h_metric = pMVar11;
    __cxa_guard_release(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_40,FinishCommand::metrics_h_metric);
  this_00 = result->edge;
  local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"deps","");
  Edge::GetBinding(&local_f0,this_00,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_110.field_2;
  local_110._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"msvc_deps_prefix","");
  Edge::GetBinding(&local_c8,this_00,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
  }
  if (local_f0._M_string_length != 0) {
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    local_110._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = ExtractDeps(this,result,&local_f0,&local_c8,&local_88,&local_110);
    if ((!bVar2) && (result->status == ExitSuccess)) {
      if ((result->output)._M_string_length != 0) {
        std::__cxx11::string::append((char *)&result->output);
      }
      std::__cxx11::string::_M_append((char *)&result->output,(ulong)local_110._M_dataplus._M_p);
      result->status = ExitFailure;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p,
                      CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                               local_110.field_2._M_local_buf[0]) + 1);
    }
  }
  BuildStatus::BuildEdgeFinished
            (this->status_,this_00,result->status == ExitSuccess,&result->output,&local_cc,&local_d0
            );
  if (result->status != ExitSuccess) {
    bVar2 = Plan::EdgeFinished(&this->plan_,this_00,kEdgeFailed,err);
    goto LAB_0010a238;
  }
  local_110._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"restat","");
  bVar2 = Edge::GetBindingBool(this_00,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
  }
  if (this->config_[4] == (BuildConfig)0x0) {
    ppNVar13 = (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppNVar13 ==
        (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      mtime = 0;
      goto LAB_00109f83;
    }
    local_48 = &this->plan_;
    local_50 = &this->scan_;
    bVar4 = false;
    mtime = 0;
    do {
      lVar8 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                        (this->disk_interface_,*ppNVar13,err);
      if (lVar8 == -1) goto LAB_0010a236;
      if (mtime < lVar8) {
        mtime = lVar8;
      }
      if ((*ppNVar13)->mtime_ == lVar8 && bVar2) {
        bVar3 = Plan::CleanNode(local_48,local_50,*ppNVar13,err);
        bVar4 = true;
        if (!bVar3) goto LAB_0010a236;
      }
      ppNVar13 = ppNVar13 + 1;
    } while (ppNVar13 !=
             (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if (!bVar4) goto LAB_00109f83;
    ppNVar6 = (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish + -(long)this_00->order_only_deps_;
    lVar8 = 0;
    for (ppNVar13 = (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppNVar13 != ppNVar6; ppNVar13 = ppNVar13 + 1)
    {
      lVar7 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                        (this->disk_interface_,*ppNVar13,err);
      if (lVar7 == -1) goto LAB_0010a236;
      if (lVar8 < lVar7) {
        lVar8 = lVar7;
      }
      ppNVar6 = (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish + -(long)this_00->order_only_deps_;
    }
    Edge::GetUnescapedDepfile_abi_cxx11_(&local_110,this_00);
    if (lVar8 == 0) {
      lVar8 = 0;
LAB_0010a202:
      this->status_->total_edges_ = (this->plan_).command_edges_;
      bVar2 = true;
    }
    else {
      if ((local_f0._M_string_length != 0) || (local_110._M_string_length == 0)) goto LAB_0010a202;
      lVar7 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                        (this->disk_interface_,&local_110,err);
      if (lVar8 < lVar7) {
        lVar8 = lVar7;
      }
      if (lVar7 != -1) goto LAB_0010a202;
      bVar2 = false;
      lVar8 = mtime;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,
                      CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                               local_110.field_2._M_local_buf[0]) + 1);
    }
    mtime = lVar8;
    if (bVar2) goto LAB_00109f83;
  }
  else {
    mtime = 0;
LAB_00109f83:
    bVar2 = Plan::EdgeFinished(&this->plan_,this_00,kEdgeSucceeded,err);
    if (bVar2) {
      Edge::GetUnescapedRspfile_abi_cxx11_(&local_110,this_00);
      if ((local_110._M_string_length != 0) && (g_keep_rsp == false)) {
        (**(code **)(*(long *)this->disk_interface_ + 0x30))(this->disk_interface_,&local_110);
      }
      this_01 = (this->scan_).build_log_;
      if ((this_01 == (BuildLog *)0x0) ||
         (bVar2 = BuildLog::RecordCommand(this_01,this_00,local_cc,local_d0,mtime), bVar2)) {
        bVar2 = true;
        if ((local_f0._M_string_length != 0) && (this->config_[4] == (BuildConfig)0x0)) {
          ppNVar13 = (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                     .super__Vector_impl_data._M_start;
          if (ppNVar13 ==
              (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            __assert_fail("!edge->outputs_.empty() && \"should have been rejected by parser\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                          ,0x40b,"bool Builder::FinishCommand(CommandRunner::Result *, string *)");
          }
          do {
            lVar8 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                              (this->disk_interface_,*ppNVar13,err);
            bVar2 = lVar8 != -1;
            if (lVar8 == -1) break;
            bVar4 = DepsLog::RecordDeps((this->scan_).dep_loader_.deps_log_,*ppNVar13,lVar8,
                                        &local_88);
            if (!bVar4) {
              local_a8[0] = local_98;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_a8,"Error writing to deps log: ","");
              piVar9 = __errno_location();
              strerror(*piVar9);
              plVar10 = (long *)std::__cxx11::string::append((char *)local_a8);
              goto LAB_0010a0ba;
            }
            ppNVar13 = ppNVar13 + 1;
          } while (ppNVar13 !=
                   (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
      }
      else {
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a8,"Error writing to build log: ","");
        piVar9 = __errno_location();
        strerror(*piVar9);
        plVar10 = (long *)std::__cxx11::string::append((char *)local_a8);
LAB_0010a0ba:
        plVar12 = plVar10 + 2;
        if ((long *)*plVar10 == plVar12) {
          local_60 = *plVar12;
          lStack_58 = plVar10[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar12;
          local_70 = (long *)*plVar10;
        }
        local_68 = plVar10[1];
        *plVar10 = (long)plVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::operator=((string *)err,(string *)&local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if (local_a8[0] != local_98) {
          operator_delete(local_a8[0],local_98[0] + 1);
        }
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,
                        CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                 local_110.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_0010a238;
    }
  }
LAB_0010a236:
  bVar2 = false;
LAB_0010a238:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ScopedMetric::~ScopedMetric(&local_40);
  return bVar2;
}

Assistant:

bool Builder::FinishCommand(CommandRunner::Result* result, string* err) {
  METRIC_RECORD("FinishCommand");

  Edge* edge = result->edge;

  // First try to extract dependencies from the result, if any.
  // This must happen first as it filters the command output (we want
  // to filter /showIncludes output, even on compile failure) and
  // extraction itself can fail, which makes the command fail from a
  // build perspective.
  vector<Node*> deps_nodes;
  string deps_type = edge->GetBinding("deps");
  const string deps_prefix = edge->GetBinding("msvc_deps_prefix");
  if (!deps_type.empty()) {
    string extract_err;
    if (!ExtractDeps(result, deps_type, deps_prefix, &deps_nodes,
                     &extract_err) &&
        result->success()) {
      if (!result->output.empty())
        result->output.append("\n");
      result->output.append(extract_err);
      result->status = ExitFailure;
    }
  }

  int start_time, end_time;
  status_->BuildEdgeFinished(edge, result->success(), result->output,
                             &start_time, &end_time);

  // The rest of this function only applies to successful commands.
  if (!result->success()) {
    return plan_.EdgeFinished(edge, Plan::kEdgeFailed, err);
  }

  // Restat the edge outputs
  TimeStamp output_mtime = 0;
  bool restat = edge->GetBindingBool("restat");
  if (!config_.dry_run) {
    bool node_cleaned = false;

    for (vector<Node*>::iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o) {
      TimeStamp new_mtime = disk_interface_->Stat((*o)->path(), err);
      if (new_mtime == -1)
        return false;
      if (new_mtime > output_mtime)
        output_mtime = new_mtime;
      if ((*o)->mtime() == new_mtime && restat) {
        // The rule command did not change the output.  Propagate the clean
        // state through the build graph.
        // Note that this also applies to nonexistent outputs (mtime == 0).
        if (!plan_.CleanNode(&scan_, *o, err))
          return false;
        node_cleaned = true;
      }
    }

    if (node_cleaned) {
      TimeStamp restat_mtime = 0;
      // If any output was cleaned, find the most recent mtime of any
      // (existing) non-order-only input or the depfile.
      for (vector<Node*>::iterator i = edge->inputs_.begin();
           i != edge->inputs_.end() - edge->order_only_deps_; ++i) {
        TimeStamp input_mtime = disk_interface_->Stat((*i)->path(), err);
        if (input_mtime == -1)
          return false;
        if (input_mtime > restat_mtime)
          restat_mtime = input_mtime;
      }

      string depfile = edge->GetUnescapedDepfile();
      if (restat_mtime != 0 && deps_type.empty() && !depfile.empty()) {
        TimeStamp depfile_mtime = disk_interface_->Stat(depfile, err);
        if (depfile_mtime == -1)
          return false;
        if (depfile_mtime > restat_mtime)
          restat_mtime = depfile_mtime;
      }

      // The total number of edges in the plan may have changed as a result
      // of a restat.
      status_->PlanHasTotalEdges(plan_.command_edge_count());

      output_mtime = restat_mtime;
    }
  }

  if (!plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, err))
    return false;

  // Delete any left over response file.
  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty() && !g_keep_rsp)
    disk_interface_->RemoveFile(rspfile);

  if (scan_.build_log()) {
    if (!scan_.build_log()->RecordCommand(edge, start_time, end_time,
                                          output_mtime)) {
      *err = string("Error writing to build log: ") + strerror(errno);
      return false;
    }
  }

  if (!deps_type.empty() && !config_.dry_run) {
    assert(!edge->outputs_.empty() && "should have been rejected by parser");
    for (std::vector<Node*>::const_iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o) {
      TimeStamp deps_mtime = disk_interface_->Stat((*o)->path(), err);
      if (deps_mtime == -1)
        return false;
      if (!scan_.deps_log()->RecordDeps(*o, deps_mtime, deps_nodes)) {
        *err = std::string("Error writing to deps log: ") + strerror(errno);
        return false;
      }
    }
  }
  return true;
}